

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall printing_callbacks::on_boolean(printing_callbacks *this,bool value)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bool: ",6);
  *(uint *)(&std::ifstream::typeinfo + *(long *)(std::cout + -0x18)) =
       *(uint *)(&std::ifstream::typeinfo + *(long *)(std::cout + -0x18)) | 1;
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void on_boolean(bool value)
    {
        std::cout << "bool: " << std::boolalpha << value << std::endl;
    }